

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float3 ConvexDecomposition::operator*(Quaternion *q,float3 *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float3 fVar14;
  
  fVar1 = (q->super_float4).x;
  fVar2 = (q->super_float4).y;
  fVar3 = (q->super_float4).z;
  fVar4 = (q->super_float4).w;
  auVar12 = SUB6416(ZEXT464(0x3f800000),0);
  auVar13 = SUB6416(ZEXT464(0xc0000000),0);
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3)),auVar13,auVar12);
  fVar8 = fVar1 * fVar2 - fVar4 * fVar3;
  fVar5 = v->x;
  fVar6 = v->y;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fVar8 + fVar8))),ZEXT416((uint)fVar5),auVar9);
  fVar7 = fVar1 * fVar3 + fVar4 * fVar2;
  fVar8 = v->z;
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 + fVar7)),ZEXT416((uint)fVar8),auVar9);
  fVar7 = fVar1 * fVar2 + fVar4 * fVar3;
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar3 * fVar3)),auVar13,auVar12);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * auVar10._0_4_)),ZEXT416((uint)fVar5),
                            ZEXT416((uint)(fVar7 + fVar7)));
  fVar7 = fVar2 * fVar3 - fVar4 * fVar1;
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 + fVar7)),ZEXT416((uint)fVar8),auVar10);
  auVar9 = vinsertps_avx(auVar9,auVar10,0x10);
  fVar7 = fVar1 * fVar3 - fVar4 * fVar2;
  fVar3 = fVar2 * fVar3 + fVar4 * fVar1;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fVar3 + fVar3))),ZEXT416((uint)fVar5),
                            ZEXT416((uint)(fVar7 + fVar7)));
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2)),auVar13,auVar12);
  auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar8),auVar11);
  fVar14._0_8_ = auVar9._0_8_;
  fVar14.z = auVar10._0_4_;
  return fVar14;
}

Assistant:

float3 operator*( const Quaternion& q, const float3& v )
{
	// The following is equivalent to:
	//return (q.getmatrix() * v);
	float qx2 = q.x*q.x;
	float qy2 = q.y*q.y;
	float qz2 = q.z*q.z;

	float qxqy = q.x*q.y;
	float qxqz = q.x*q.z;
	float qxqw = q.x*q.w;
	float qyqz = q.y*q.z;
	float qyqw = q.y*q.w;
	float qzqw = q.z*q.w;
	return float3(
		(1-2*(qy2+qz2))*v.x + (2*(qxqy-qzqw))*v.y + (2*(qxqz+qyqw))*v.z ,
		(2*(qxqy+qzqw))*v.x + (1-2*(qx2+qz2))*v.y + (2*(qyqz-qxqw))*v.z ,
		(2*(qxqz-qyqw))*v.x + (2*(qyqz+qxqw))*v.y + (1-2*(qx2+qy2))*v.z  );
}